

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmSetPropertyCommand::HandleCacheMode(cmSetPropertyCommand *this)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  cmake *pcVar5;
  char *pcVar6;
  _Rb_tree_node_base *p_Var7;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  psVar1 = &this->PropertyName;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar3 == 0) {
    if (this->Remove == false) {
      bVar2 = cmSystemTools::IsOn(&this->PropertyValue);
      if ((!bVar2) && (bVar2 = cmSystemTools::IsOff(&this->PropertyValue), !bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"given non-boolean value \"",0x19);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,(this->PropertyValue)._M_dataplus._M_p,
                            (this->PropertyValue)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"\" for CACHE property \"ADVANCED\".  ",0x22);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1c0);
        goto LAB_0021ec11;
      }
    }
LAB_0021eaee:
    bVar2 = true;
    for (p_Var7 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != &(this->Names)._M_t._M_impl.super__Rb_tree_header;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      pcVar5 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
      pcVar6 = cmState::GetCacheEntryValue(pcVar5->State,(string *)(p_Var7 + 1));
      if (pcVar6 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"could not find CACHE variable ",0x1e);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,".  Perhaps it has not yet been created.",0x27);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1c0);
        goto LAB_0021ec11;
      }
      HandleCacheEntry(this,(string *)(p_Var7 + 1));
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 == 0) {
      bVar2 = cmState::IsCacheEntryType(&this->PropertyValue);
      if (bVar2) goto LAB_0021eaee;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"given invalid CACHE entry TYPE \"",0x20);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(this->PropertyValue)._M_dataplus._M_p,
                          (this->PropertyValue)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) goto LAB_0021eaee;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a0,"given invalid CACHE property ",0x1d);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a0,(this->PropertyName)._M_dataplus._M_p,
                          (this->PropertyName)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,".  ",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"Settable CACHE properties are: ",0x1f);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.",0x2f);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
    }
LAB_0021ec11:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheMode()
{
  if (this->PropertyName == "ADVANCED") {
    if (!this->Remove && !cmSystemTools::IsOn(this->PropertyValue) &&
        !cmSystemTools::IsOff(this->PropertyValue)) {
      std::ostringstream e;
      e << "given non-boolean value \"" << this->PropertyValue
        << "\" for CACHE property \"ADVANCED\".  ";
      this->SetError(e.str());
      return false;
    }
  } else if (this->PropertyName == "TYPE") {
    if (!cmState::IsCacheEntryType(this->PropertyValue)) {
      std::ostringstream e;
      e << "given invalid CACHE entry TYPE \"" << this->PropertyValue << "\"";
      this->SetError(e.str());
      return false;
    }
  } else if (this->PropertyName != "HELPSTRING" &&
             this->PropertyName != "STRINGS" &&
             this->PropertyName != "VALUE") {
    std::ostringstream e;
    e << "given invalid CACHE property " << this->PropertyName << ".  "
      << "Settable CACHE properties are: "
      << "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.";
    this->SetError(e.str());
    return false;
  }

  for (std::string const& name : this->Names) {
    // Get the source file.
    cmMakefile* mf = this->GetMakefile();
    cmake* cm = mf->GetCMakeInstance();
    const char* existingValue = cm->GetState()->GetCacheEntryValue(name);
    if (existingValue) {
      if (!this->HandleCacheEntry(name)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "could not find CACHE variable " << name
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}